

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
* Lexer::tokenize(vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
                  *__return_storage_ptr__,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  Type type;
  string token;
  Lexer lexer;
  Type local_94;
  string local_90;
  Lexer local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_70._text.field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._text._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + input->_M_string_length);
  local_70._cursor = 0;
  local_70._eos = input->_M_string_length;
  local_70._enableString = true;
  local_70._enableDate = true;
  local_70._enableDuration = true;
  local_70._enableUUID = true;
  local_70._enableHexNumber = true;
  local_70._enableWord = true;
  local_70._enableURL = true;
  local_70._enablePath = true;
  local_70._enablePattern = true;
  local_70._enableOperator = true;
  while( true ) {
    bVar3 = Lexer::token(&local_70,&local_90,&local_94);
    if (!bVar3) break;
    std::
    vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
    ::emplace_back<std::__cxx11::string&,Lexer::Type&>
              ((vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
                *)__return_storage_ptr__,&local_90,&local_94);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._text._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._text._M_dataplus._M_p,local_70._text.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <std::tuple <std::string, Lexer::Type>> Lexer::tokenize (const std::string& input)
{
  std::vector <std::tuple <std::string, Lexer::Type>> tokens;

  std::string token;
  Lexer::Type type;
  Lexer lexer (input);
  while (lexer.token (token, type))
    tokens.emplace_back (token, type);

  return tokens;
}